

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent::tracker_request_error
          (torrent *this,tracker_request *r,error_code *ec,string *msg,seconds32 retry_interval)

{
  per_timer_data *ppVar1;
  string *psVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  time_point32 now;
  pointer paVar6;
  session_settings *this_00;
  undefined8 uVar7;
  undefined8 uVar8;
  announce_entry *paVar9;
  error_category *peVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  announce_entry *paVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  bool local_1fd;
  undefined1 local_1e0 [24];
  announce_endpoint *aep_1;
  endpoint local_endpoint_1;
  announce_entry *ae_1;
  undefined1 local_180 [56];
  int local_148;
  undefined1 local_144 [4];
  int tracker_index;
  string local_128;
  string local_108;
  error_condition local_e8;
  error_condition local_d8;
  string local_c8;
  rep_conflict local_a4;
  __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
  local_a0;
  per_timer_data *local_98;
  announce_endpoint *local_90;
  undefined1 local_88 [16];
  __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
  aep;
  endpoint local_endpoint;
  int fails;
  announce_entry *ae;
  per_timer_data *local_30;
  string *msg_local;
  error_code *ec_local;
  tracker_request *r_local;
  torrent *this_local;
  seconds32 retry_interval_local;
  
  local_30 = (per_timer_data *)msg;
  msg_local = (string *)ec;
  ec_local = (error_code *)r;
  r_local = (tracker_request *)this;
  this_local._4_4_ = retry_interval.__r;
  uVar4 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((uVar4 & 1) != 0) {
    uVar4 = boost::system::error_code::value((error_code *)msg_local);
    boost::system::error_code::message_abi_cxx11_((string *)&ae,(error_code *)msg_local);
    uVar7 = std::__cxx11::string::c_str();
    uVar8 = std::__cxx11::string::c_str();
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** tracker error: (%d) %s %s",(ulong)uVar4,uVar7,uVar8);
    std::__cxx11::string::~string((string *)&ae);
  }
  if (((ulong)ec_local[9].cat_ & 0x1000000) == 0) {
    register0x00000000 = find_tracker(this,(string *)ec_local);
    local_endpoint.impl_.data_._20_4_ = 0;
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)&aep);
    if (stack0xffffffffffffffa8 != (announce_entry *)0x0) {
      local_88._0_8_ =
           std::
           vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>::
           begin(&stack0xffffffffffffffa8->endpoints);
      local_90 = (announce_endpoint *)
                 std::
                 vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
                 ::end(&stack0xffffffffffffffa8->endpoints);
      local_98 = (per_timer_data *)ec_local;
      local_88._8_8_ =
           std::
           find_if<__gnu_cxx::__normal_iterator<libtorrent::announce_endpoint*,std::vector<libtorrent::announce_endpoint,std::allocator<libtorrent::announce_endpoint>>>,libtorrent::torrent::tracker_request_error(libtorrent::tracker_request_const&,boost::system::error_code_const&,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::__0>
                     ((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                       )local_88._0_8_,
                      (__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                       )local_90,(anon_class_8_1_54a39812_for__M_pred)ec_local);
      local_a0._M_current =
           (announce_endpoint *)
           std::
           vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>::
           end(&stack0xffffffffffffffa8->endpoints);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                          *)(local_88 + 8),&local_a0);
      if (bVar3) {
        paVar6 = __gnu_cxx::
                 __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                 ::operator->((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                               *)(local_88 + 8));
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
                  ((basic_endpoint<boost::asio::ip::tcp> *)&aep,&paVar6->local_endpoint);
        paVar6 = __gnu_cxx::
                 __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                 ::operator->((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                               *)(local_88 + 8));
        this_00 = settings(this);
        iVar5 = libtorrent::aux::session_settings::get_int(this_00,0x406c);
        local_a4 = this_local._4_4_;
        announce_endpoint::failed(paVar6,iVar5,this_local._4_4_);
        psVar2 = msg_local;
        paVar6 = __gnu_cxx::
                 __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                 ::operator->((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                               *)(local_88 + 8));
        ppVar1 = local_30;
        uVar7 = *(undefined8 *)psVar2;
        (paVar6->last_error).val_ = (int)uVar7;
        (paVar6->last_error).failed_ = (bool)(char)((ulong)uVar7 >> 0x20);
        *(int3 *)&(paVar6->last_error).field_0x5 = (int3)((ulong)uVar7 >> 0x28);
        (paVar6->last_error).cat_ = (error_category *)psVar2->_M_string_length;
        paVar6 = __gnu_cxx::
                 __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                 ::operator->((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                               *)(local_88 + 8));
        std::__cxx11::string::operator=((string *)paVar6,(string *)ppVar1);
        paVar6 = __gnu_cxx::
                 __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                 ::operator->((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                               *)(local_88 + 8));
        local_endpoint.impl_.data_._20_4_ = ZEXT14((byte)*(undefined2 *)&paVar6->field_0x74 & 0x7f);
        paVar6 = __gnu_cxx::
                 __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                 ::operator->((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                               *)(local_88 + 8));
        print_endpoint_abi_cxx11_(&local_c8,(libtorrent *)&paVar6->local_endpoint,ep);
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        paVar6 = __gnu_cxx::
                 __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                 ::operator->((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                               *)(local_88 + 8));
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** increment tracker fail count [ep: %s url: %s %d]",uVar7,uVar8,
                   (ulong)((byte)*(undefined2 *)&paVar6->field_0x74 & 0x7f));
        std::__cxx11::string::~string((string *)&local_c8);
        psVar2 = msg_local;
        boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                  (&local_d8,address_family_not_supported,(type *)0x0);
        bVar3 = boost::system::operator==((error_code *)psVar2,&local_d8);
        psVar2 = msg_local;
        local_1fd = true;
        if (!bVar3) {
          boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                    (&local_e8,host_unreachable,(type *)0x0);
          local_1fd = boost::system::operator==((error_code *)psVar2,&local_e8);
        }
        if (local_1fd != false) {
          paVar6 = __gnu_cxx::
                   __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                   ::operator->((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                                 *)(local_88 + 8));
          *(ushort *)&paVar6->field_0x74 = *(ushort *)&paVar6->field_0x74 & 0xf7ff;
          paVar6 = __gnu_cxx::
                   __normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                   ::operator->((__normal_iterator<libtorrent::announce_endpoint_*,_std::vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>_>
                                 *)(local_88 + 8));
          print_endpoint_abi_cxx11_(&local_108,(libtorrent *)&paVar6->local_endpoint,ep_00);
          uVar7 = std::__cxx11::string::c_str();
          uVar8 = std::__cxx11::string::c_str();
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** disabling endpoint [ep: %s url: %s ]",uVar7,uVar8);
          std::__cxx11::string::~string((string *)&local_108);
        }
      }
      else {
        bVar3 = libtorrent::aux::listen_socket_handle::operator_cast_to_bool
                          ((listen_socket_handle *)(ec_local + 0x10));
        if (bVar3) {
          uVar7 = std::__cxx11::string::c_str();
          libtorrent::aux::listen_socket_handle::get_local_endpoint
                    ((endpoint *)local_144,(listen_socket_handle *)(ec_local + 0x10));
          print_endpoint_abi_cxx11_(&local_128,(libtorrent *)local_144,ep_01);
          uVar8 = std::__cxx11::string::c_str();
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** no matching endpoint for request [%s, %s]",uVar7,uVar8);
          std::__cxx11::string::~string((string *)&local_128);
        }
      }
      paVar11 = stack0xffffffffffffffa8;
      paVar9 = std::vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>
               ::data(&(this->m_trackers).
                       super_vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>
                     );
      psVar2 = msg_local;
      local_148 = (int)(((long)paVar11 - (long)paVar9) / 0x60);
      peVar10 = http_category();
      boost::system::error_code::error_code((error_code *)(local_180 + 0x28),0x19a,peVar10);
      bVar3 = boost::system::operator==((error_code *)psVar2,(error_code *)(local_180 + 0x28));
      if (bVar3) {
        stack0xffffffffffffffa8->fail_limit = '\x01';
      }
      local_180._32_8_ =
           std::
           vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>::
           begin(&stack0xffffffffffffffa8->endpoints);
      local_180._24_8_ =
           std::
           vector<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>::
           end(&stack0xffffffffffffffa8->endpoints);
      bVar3 = std::
              all_of<__gnu_cxx::__normal_iterator<libtorrent::announce_endpoint*,std::vector<libtorrent::announce_endpoint,std::allocator<libtorrent::announce_endpoint>>>,libtorrent::torrent::tracker_request_error(libtorrent::tracker_request_const&,boost::system::error_code_const&,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::__1>
                        (local_180._32_8_,local_180._24_8_);
      if (bVar3) {
        deprioritize_tracker(this,local_148);
      }
    }
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    bVar3 = alert_manager::should_post<libtorrent::tracker_error_alert>
                      ((alert_manager *)CONCAT44(extraout_var,iVar5));
    if ((bVar3) || ((ec_local[0x11].val_ & 0x100) != 0)) {
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_180);
      alert_manager::
      emplace_alert<libtorrent::tracker_error_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int&,std::__cxx11::string_const&,boost::system::error_code_const&,std::__cxx11::string_const&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar5),(torrent_handle *)local_180,
                 (basic_endpoint<boost::asio::ip::tcp> *)&aep,
                 (int *)((long)&local_endpoint.impl_.data_ + 0x14),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ec_local,
                 (error_code *)msg_local,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
      torrent_handle::~torrent_handle((torrent_handle *)local_180);
    }
  }
  else {
    paVar11 = find_tracker(this,(string *)ec_local);
    psVar2 = msg_local;
    peVar10 = http_category();
    boost::system::error_code::error_code
              ((error_code *)((long)&local_endpoint_1.impl_.data_.v6.sin6_addr.__in6_u + 0xc),0x19a,
               peVar10);
    bVar3 = boost::system::operator==
                      ((error_code *)psVar2,
                       (error_code *)
                       ((long)&local_endpoint_1.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
    if ((bVar3) && (paVar11 != (announce_entry *)0x0)) {
      paVar11->fail_limit = '\x01';
    }
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    bVar3 = alert_manager::should_post<libtorrent::scrape_failed_alert>
                      ((alert_manager *)CONCAT44(extraout_var_01,iVar5));
    if ((bVar3) || ((ec_local[0x11].val_ & 0x100) != 0)) {
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                ((basic_endpoint<boost::asio::ip::tcp> *)((long)&aep_1 + 4));
      if ((paVar11 != (announce_entry *)0x0) &&
         (local_1e0._16_8_ =
               announce_entry::find_endpoint(paVar11,(listen_socket_handle *)(ec_local + 0x10)),
         (element_type *)local_1e0._16_8_ != (element_type *)0x0)) {
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
                  ((basic_endpoint<boost::asio::ip::tcp> *)((long)&aep_1 + 4),
                   (basic_endpoint<boost::asio::ip::tcp> *)
                   &(((element_type *)local_1e0._16_8_)->m_files).m_file_hashes.
                    super_vector<const_char_*,_std::allocator<const_char_*>_>.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_1e0);
      alert_manager::
      emplace_alert<libtorrent::scrape_failed_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,std::__cxx11::string_const&,boost::system::error_code_const&>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar5),(torrent_handle *)local_1e0,
                 (basic_endpoint<boost::asio::ip::tcp> *)((long)&aep_1 + 4),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ec_local,
                 (error_code *)msg_local);
      torrent_handle::~torrent_handle((torrent_handle *)local_1e0);
    }
  }
  if ((((*(ulong *)&(this->super_torrent_hot_members).field_0x38 >> 0x1a & 1) == 0) &&
      (bVar3 = is_paused(this), !bVar3)) || (*(char *)((long)&ec_local[9].cat_ + 2) == '\x03')) {
    announce_with_tracker(this,*(uint8_t *)((long)&ec_local[9].cat_ + 2));
  }
  now = libtorrent::aux::time_now32();
  update_tracker_timer(this,now);
  return;
}

Assistant:

void torrent::tracker_request_error(tracker_request const& r
		, error_code const& ec, std::string const& msg
		, seconds32 const retry_interval)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** tracker error: (%d) %s %s", ec.value()
				, ec.message().c_str(), msg.c_str());
		}
#endif
		if (0 == (r.kind & tracker_request::scrape_request))
		{
			// announce request
			announce_entry* ae = find_tracker(r.url);
			int fails = 0;
			tcp::endpoint local_endpoint;
			if (ae)
			{
				auto aep = std::find_if(ae->endpoints.begin(), ae->endpoints.end()
					, [&](announce_endpoint const& e) { return e.socket == r.outgoing_socket; });

				if (aep != ae->endpoints.end())
				{
					local_endpoint = aep->local_endpoint;
					aep->failed(settings().get_int(settings_pack::tracker_backoff)
						, retry_interval);
					aep->last_error = ec;
					aep->message = msg;
					fails = aep->fails;
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** increment tracker fail count [ep: %s url: %s %d]"
						, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str(), aep->fails);
#endif
					// don't try to announce from this endpoint again
					if (ec == boost::system::errc::address_family_not_supported
						|| ec == boost::system::errc::host_unreachable)
					{
						aep->enabled = false;
#ifndef TORRENT_DISABLE_LOGGING
						debug_log("*** disabling endpoint [ep: %s url: %s ]"
							, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str());
#endif
					}
				}
				else if (r.outgoing_socket)
				{
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** no matching endpoint for request [%s, %s]"
						, r.url.c_str(), print_endpoint(r.outgoing_socket.get_local_endpoint()).c_str());
#endif
				}

				int const tracker_index = int(ae - m_trackers.data());

				// never talk to this tracker again
				if (ec == error_code(410, http_category())) ae->fail_limit = 1;

				// if all endpoints fail, then we de-prioritize the tracker and try
				// the next one in the tier
				if (std::all_of(ae->endpoints.begin(), ae->endpoints.end()
					, [](announce_endpoint const& ep) { return ep.fails > 0; }))
				{
					deprioritize_tracker(tracker_index);
				}
			}
			if (m_ses.alerts().should_post<tracker_error_alert>()
				|| r.triggered_manually)
			{
				m_ses.alerts().emplace_alert<tracker_error_alert>(get_handle()
					, local_endpoint, fails, r.url, ec, msg);
			}
		}
		else
		{
			announce_entry* ae = find_tracker(r.url);

			// scrape request
			if (ec == error_code(410, http_category()))
			{
				// never talk to this tracker again
				if (ae != nullptr) ae->fail_limit = 1;
			}

			// if this was triggered manually we need to post this unconditionally,
			// since the client expects a response from its action, regardless of
			// whether all tracker events have been enabled by the alert mask
			if (m_ses.alerts().should_post<scrape_failed_alert>()
				|| r.triggered_manually)
			{
				tcp::endpoint local_endpoint;
				if (ae != nullptr)
				{
					auto aep = ae->find_endpoint(r.outgoing_socket);
					if (aep != nullptr) local_endpoint = aep->local_endpoint;
				}

				m_ses.alerts().emplace_alert<scrape_failed_alert>(get_handle(), local_endpoint, r.url, ec);
			}
		}
		// announce to the next working tracker
		if ((!m_abort && !is_paused()) || r.event == tracker_request::stopped)
			announce_with_tracker(r.event);
		update_tracker_timer(aux::time_now32());
	}